

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON__UINT_PTR ON_SubDHeap::ArrayCapacity(size_t capacity,ON__UINT_PTR *a)

{
  if (a != (ON__UINT_PTR *)0x0) {
    return a[-1];
  }
  return 0;
}

Assistant:

ON__UINT_PTR ON_SubDHeap::ArrayCapacity(
  size_t capacity,
  ON__UINT_PTR* a
  )
{
#if defined(ON_DEBUG)
  size_t acapacity = (nullptr == a) ? 0 : a[-1];
  if (capacity != acapacity)
  {
    ON_SubDIncrementErrorCount();
  }
#endif
  return (nullptr == a) ? 0 : a[-1];
}